

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

int32 feat_s2mfc_read_norm_pad
                (feat_t *fcb,char *file,int32 win,int32 sf,int32 ef,mfcc_t ***out_mfc,int32 maxfr,
                int32 cepsize)

{
  bool bVar1;
  int32 iVar2;
  uint uVar3;
  void *tmpptr;
  mfcc_t **mfc;
  int local_f0;
  int32 end_pad;
  int32 start_pad;
  int32 byterev;
  int32 n;
  int32 i;
  stat statbuf;
  float32 *float_feat;
  FILE *pFStack_40;
  int32 n_float32;
  FILE *fp;
  mfcc_t ***out_mfc_local;
  uint local_28;
  int32 ef_local;
  int32 sf_local;
  int32 win_local;
  char *file_local;
  feat_t *fcb_local;
  
  if (out_mfc != (mfcc_t ***)0x0) {
    *out_mfc = (mfcc_t **)0x0;
  }
  fp = (FILE *)out_mfc;
  out_mfc_local._4_4_ = ef;
  local_28 = sf;
  ef_local = win;
  _sf_local = file;
  file_local = (char *)fcb;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
          ,0x3ff,"Reading mfc file: \'%s\'[%d..%d]\n",file,(ulong)(uint)sf,ef);
  if (((int)out_mfc_local._4_4_ < 0) || ((int)local_28 < (int)out_mfc_local._4_4_)) {
    iVar2 = stat_retry(_sf_local,(stat *)&n);
    if ((iVar2 < 0) || (pFStack_40 = fopen(_sf_local,"rb"), pFStack_40 == (FILE *)0x0)) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                     ,0x408,"Failed to open file \'%s\' for reading",_sf_local);
      fcb_local._4_4_ = -1;
    }
    else {
      iVar2 = fread_retry((void *)((long)&float_feat + 4),4,1,(FILE *)pFStack_40);
      if (iVar2 == 1) {
        bVar1 = false;
        if (float_feat._4_4_ * 4 + 4 != (int)statbuf.st_rdev) {
          uVar3 = (int)float_feat._4_4_ >> 0x18 & 0xffU | (int)float_feat._4_4_ >> 8 & 0xff00U |
                  (float_feat._4_4_ & 0xff00) << 8 | float_feat._4_4_ << 0x18;
          if (uVar3 * 4 + 4 != (int)statbuf.st_rdev) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                    ,0x41d,"%s: Header size field: %d(%08x); filesize: %d(%08x)\n",_sf_local,
                    (ulong)float_feat._4_4_,float_feat._4_4_,statbuf.st_rdev,statbuf.st_rdev);
            fclose(pFStack_40);
            return -1;
          }
          bVar1 = true;
          float_feat._4_4_ = uVar3;
        }
        if ((int)float_feat._4_4_ < 1) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x426,"%s: Header size field (#floats) = %d\n",_sf_local,(ulong)float_feat._4_4_,
                  ef);
          fclose(pFStack_40);
          fcb_local._4_4_ = -1;
        }
        else {
          start_pad = (int)float_feat._4_4_ / cepsize;
          if (start_pad * cepsize == float_feat._4_4_) {
            if (((int)local_28 < 1) || ((int)local_28 < start_pad)) {
              if ((int)out_mfc_local._4_4_ < 0) {
                out_mfc_local._4_4_ = start_pad - 1;
              }
              else if (start_pad <= (int)out_mfc_local._4_4_) {
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                        ,0x441,"%s: End frame (%d) beyond file size (%d), will truncate\n",_sf_local
                        ,(ulong)out_mfc_local._4_4_,start_pad);
                out_mfc_local._4_4_ = start_pad - 1;
              }
              local_28 = local_28 - ef_local;
              out_mfc_local._4_4_ = ef_local + out_mfc_local._4_4_;
              if ((int)local_28 < 0) {
                local_f0 = -local_28;
                local_28 = 0;
              }
              else {
                local_f0 = 0;
              }
              if ((int)out_mfc_local._4_4_ < start_pad) {
                mfc._4_4_ = 0;
              }
              else {
                mfc._4_4_ = (out_mfc_local._4_4_ - start_pad) + 1;
                out_mfc_local._4_4_ = start_pad + -1;
              }
              if ((int)((out_mfc_local._4_4_ - local_28) + 1) < start_pad) {
                start_pad = (out_mfc_local._4_4_ - local_28) + 1;
              }
              if ((maxfr < 1) || (start_pad + local_f0 + mfc._4_4_ <= maxfr)) {
                if (fp != (FILE *)0x0) {
                  tmpptr = __ckd_calloc_2d__((long)(start_pad + local_f0 + mfc._4_4_),(long)cepsize,
                                             4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                             ,0x462);
                  if (0 < (int)local_28) {
                    fseek(pFStack_40,(long)(int)(local_28 * cepsize) << 2,1);
                  }
                  float_feat._4_4_ = start_pad * cepsize;
                  statbuf.__glibc_reserved[2] = *(undefined8 *)((long)tmpptr + (long)local_f0 * 8);
                  uVar3 = fread_retry((void *)statbuf.__glibc_reserved[2],4,float_feat._4_4_,
                                      (FILE *)pFStack_40);
                  if (uVar3 != float_feat._4_4_) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                            ,0x46c,"%s: fread(%dx%d) (MFC data) failed\n",_sf_local,
                            (ulong)(uint)start_pad,cepsize);
                    ckd_free_2d(tmpptr);
                    fclose(pFStack_40);
                    return -1;
                  }
                  if (bVar1) {
                    for (byterev = 0; byterev < (int)float_feat._4_4_; byterev = byterev + 1) {
                      *(uint *)(statbuf.__glibc_reserved[2] + (long)byterev * 4) =
                           *(int *)(statbuf.__glibc_reserved[2] + (long)byterev * 4) >> 0x18 & 0xffU
                           | *(int *)(statbuf.__glibc_reserved[2] + (long)byterev * 4) >> 8 &
                             0xff00U |
                           (*(uint *)(statbuf.__glibc_reserved[2] + (long)byterev * 4) & 0xff00) <<
                           8 | *(int *)(statbuf.__glibc_reserved[2] + (long)byterev * 4) << 0x18;
                    }
                  }
                  feat_cmn((feat_t *)file_local,(mfcc_t **)((long)tmpptr + (long)local_f0 * 8),
                           start_pad,1,1);
                  feat_agc((feat_t *)file_local,(mfcc_t **)((long)tmpptr + (long)local_f0 * 8),
                           start_pad,1,1);
                  for (byterev = 0; byterev < local_f0; byterev = byterev + 1) {
                    memcpy(*(void **)((long)tmpptr + (long)byterev * 8),
                           *(void **)((long)tmpptr + (long)local_f0 * 8),(long)cepsize << 2);
                  }
                  for (byterev = 0; byterev < mfc._4_4_; byterev = byterev + 1) {
                    memcpy(*(void **)((long)tmpptr + (long)(local_f0 + start_pad + byterev) * 8),
                           *(void **)((long)tmpptr + (long)(local_f0 + start_pad + -1) * 8),
                           (long)cepsize << 2);
                  }
                  *(void **)fp = tmpptr;
                }
                fclose(pFStack_40);
                fcb_local._4_4_ = start_pad + local_f0 + mfc._4_4_;
              }
              else {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                        ,0x45a,"%s: Maximum output size(%d frames) < actual #frames(%d)\n",_sf_local
                        ,(ulong)(uint)maxfr,start_pad + local_f0 + mfc._4_4_);
                fclose(pFStack_40);
                fcb_local._4_4_ = -1;
              }
            }
            else {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                      ,0x438,"%s: Start frame (%d) beyond file size (%d)\n",_sf_local,
                      (ulong)local_28,start_pad);
              fclose(pFStack_40);
              fcb_local._4_4_ = -1;
            }
          }
          else {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                    ,0x42f,"Header size field: %d; not multiple of %d\n",(ulong)float_feat._4_4_,
                    (ulong)(uint)cepsize,ef);
            fclose(pFStack_40);
            fcb_local._4_4_ = -1;
          }
        }
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x40e,"%s: fread(#floats) failed\n",_sf_local);
        fclose(pFStack_40);
        fcb_local._4_4_ = -1;
      }
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
            ,0x401,"%s: End frame (%d) <= Start frame (%d)\n",_sf_local,(ulong)out_mfc_local._4_4_,
            local_28);
    fcb_local._4_4_ = -1;
  }
  return fcb_local._4_4_;
}

Assistant:

static int32
feat_s2mfc_read_norm_pad(feat_t *fcb, char *file, int32 win,
            		 int32 sf, int32 ef,
            		 mfcc_t ***out_mfc,
            		 int32 maxfr,
            		 int32 cepsize)
{
    FILE *fp;
    int32 n_float32;
    float32 *float_feat;
    struct stat statbuf;
    int32 i, n, byterev;
    int32 start_pad, end_pad;
    mfcc_t **mfc;

    /* Initialize the output pointer to NULL, so that any attempts to
       free() it if we fail before allocating it will not segfault! */
    if (out_mfc)
        *out_mfc = NULL;
    E_INFO("Reading mfc file: '%s'[%d..%d]\n", file, sf, ef);
    if (ef >= 0 && ef <= sf) {
        E_ERROR("%s: End frame (%d) <= Start frame (%d)\n", file, ef, sf);
        return -1;
    }

    /* Find filesize; HACK!! To get around intermittent NFS failures, use stat_retry */
    if ((stat_retry(file, &statbuf) < 0)
        || ((fp = fopen(file, "rb")) == NULL)) {
        E_ERROR_SYSTEM("Failed to open file '%s' for reading", file);
        return -1;
    }

    /* Read #floats in header */
    if (fread_retry(&n_float32, sizeof(int32), 1, fp) != 1) {
        E_ERROR("%s: fread(#floats) failed\n", file);
        fclose(fp);
        return -1;
    }

    /* Check if n_float32 matches file size */
    byterev = 0;
    if ((int32) (n_float32 * sizeof(float32) + 4) != (int32) statbuf.st_size) { /* RAH, typecast both sides to remove compile warning */
        n = n_float32;
        SWAP_INT32(&n);

        if ((int32) (n * sizeof(float32) + 4) != (int32) (statbuf.st_size)) {   /* RAH, typecast both sides to remove compile warning */
            E_ERROR
                ("%s: Header size field: %d(%08x); filesize: %d(%08x)\n",
                 file, n_float32, n_float32, statbuf.st_size,
                 statbuf.st_size);
            fclose(fp);
            return -1;
        }

        n_float32 = n;
        byterev = 1;
    }
    if (n_float32 <= 0) {
        E_ERROR("%s: Header size field (#floats) = %d\n", file, n_float32);
        fclose(fp);
        return -1;
    }

    /* Convert n to #frames of input */
    n = n_float32 / cepsize;
    if (n * cepsize != n_float32) {
        E_ERROR("Header size field: %d; not multiple of %d\n", n_float32,
                cepsize);
        fclose(fp);
        return -1;
    }

    /* Check start and end frames */
    if (sf > 0) {
        if (sf >= n) {
            E_ERROR("%s: Start frame (%d) beyond file size (%d)\n", file,
                    sf, n);
            fclose(fp);
            return -1;
        }
    }
    if (ef < 0)
        ef = n-1;
    else if (ef >= n) {
        E_WARN("%s: End frame (%d) beyond file size (%d), will truncate\n",
               file, ef, n);
        ef = n-1;
    }

    /* Add window to start and end frames */
    sf -= win;
    ef += win;
    if (sf < 0) {
        start_pad = -sf;
        sf = 0;
    }
    else
        start_pad = 0;
    if (ef >= n) {
        end_pad = ef - n + 1;
        ef = n - 1;
    }
    else
        end_pad = 0;

    /* Limit n if indicated by [sf..ef] */
    if ((ef - sf + 1) < n)
        n = (ef - sf + 1);
    if (maxfr > 0 && n + start_pad + end_pad > maxfr) {
        E_ERROR("%s: Maximum output size(%d frames) < actual #frames(%d)\n",
                file, maxfr, n + start_pad + end_pad);
        fclose(fp);
        return -1;
    }

    /* If no output buffer was supplied, then skip the actual data reading. */
    if (out_mfc != NULL) {
        /* Position at desired start frame and read actual MFC data */
        mfc = (mfcc_t **)ckd_calloc_2d(n + start_pad + end_pad, cepsize, sizeof(mfcc_t));
        if (sf > 0)
            fseek(fp, sf * cepsize * sizeof(float32), SEEK_CUR);
        n_float32 = n * cepsize;
#ifdef FIXED_POINT
        float_feat = ckd_calloc(n_float32, sizeof(float32));
#else
        float_feat = mfc[start_pad];
#endif
        if (fread_retry(float_feat, sizeof(float32), n_float32, fp) != n_float32) {
            E_ERROR("%s: fread(%dx%d) (MFC data) failed\n", file, n, cepsize);
            ckd_free_2d(mfc);
            fclose(fp);
            return -1;
        }
        if (byterev) {
            for (i = 0; i < n_float32; i++) {
                SWAP_FLOAT32(&float_feat[i]);
            }
        }
#ifdef FIXED_POINT
        for (i = 0; i < n_float32; ++i) {
            mfc[start_pad][i] = FLOAT2MFCC(float_feat[i]);
        }
        ckd_free(float_feat);
#endif

        /* Normalize */
        feat_cmn(fcb, mfc + start_pad, n, 1, 1);
        feat_agc(fcb, mfc + start_pad, n, 1, 1);

        /* Replicate start and end frames if necessary. */
        for (i = 0; i < start_pad; ++i)
            memcpy(mfc[i], mfc[start_pad], cepsize * sizeof(mfcc_t));
        for (i = 0; i < end_pad; ++i)
            memcpy(mfc[start_pad + n + i], mfc[start_pad + n - 1],
                   cepsize * sizeof(mfcc_t));

        *out_mfc = mfc;
    }

    fclose(fp);
    return n + start_pad + end_pad;
}